

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

void __thiscall
pbrt::PiecewiseConstant2D::PiecewiseConstant2D
          (PiecewiseConstant2D *this,span<const_float> func,int nx,int ny,Bounds2f domain,
          Allocator alloc)

{
  float *pfVar1;
  size_t n;
  float *pfVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  span<const_float> f;
  Allocator alloc_local;
  Bounds2f domain_local;
  vector<float,_std::allocator<float>_> marginalFunc;
  size_t va;
  float *local_78;
  
  auVar10._8_56_ = domain._16_56_;
  auVar10._0_8_ = domain.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar9._8_56_ = domain._8_56_;
  auVar9._0_8_ = domain.pMin.super_Tuple2<pbrt::Point2,_float>;
  pfVar1 = (float *)func.n;
  pfVar2 = func.ptr;
  domain_local = (Bounds2f)vmovlhps_avx(auVar9._0_16_,auVar10._0_16_);
  pfVar6 = (float *)(long)nx;
  n = (size_t)ny;
  marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(n * (long)pfVar6);
  (this->domain).pMin.super_Tuple2<pbrt::Point2,_float> =
       domain_local.pMin.super_Tuple2<pbrt::Point2,_float>;
  (this->domain).pMax.super_Tuple2<pbrt::Point2,_float> =
       domain_local.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar8 = ZEXT816(0) << 0x20;
  (this->pConditionalY).alloc.memoryResource = alloc.memoryResource;
  (this->pConditionalY).nStored = 0;
  (this->pConditionalY).ptr = (PiecewiseConstant1D *)auVar8._0_8_;
  (this->pConditionalY).nAlloc = auVar8._8_8_;
  (this->pMarginal).func.alloc.memoryResource = alloc.memoryResource;
  (this->pMarginal).func.ptr = (float *)auVar8._0_8_;
  (this->pMarginal).func.nAlloc = auVar8._8_8_;
  (this->pMarginal).func.nStored = 0;
  (this->pMarginal).cdf.alloc.memoryResource = alloc.memoryResource;
  (this->pMarginal).cdf.ptr = (float *)auVar8._0_8_;
  (this->pMarginal).cdf.nAlloc = auVar8._8_8_;
  (this->pMarginal).cdf.nStored = 0;
  (this->pMarginal).funcInt = 0.0;
  alloc_local = alloc;
  va = (size_t)pfVar1;
  if ((long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start - (long)pfVar1 == 0) {
    pstd::
    vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
    ::reserve(&this->pConditionalY,n);
    uVar4 = (ulong)(uint)(~(ny >> 0x1f) & ny);
    uVar5 = uVar4;
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      local_78 = pfVar1;
      if (pfVar6 <= pfVar1) {
        local_78 = pfVar6;
      }
      va = (size_t)pfVar2;
      pstd::
      vector<pbrt::PiecewiseConstant1D,pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>>
      ::
      emplace_back<pstd::span<float_const>,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                ((vector<pbrt::PiecewiseConstant1D,pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>>
                  *)&this->pConditionalY,(span<const_float> *)&va,(float *)&domain_local,
                 (float *)&domain_local.pMax,&alloc_local);
      pfVar2 = pfVar2 + (long)pfVar6;
      pfVar1 = (float *)((long)pfVar1 - (long)pfVar6);
    }
    marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::reserve(&marginalFunc,n);
    for (lVar3 = 0; uVar4 * 0x50 - lVar3 != 0; lVar3 = lVar3 + 0x50) {
      std::vector<float,_std::allocator<float>_>::push_back
                (&marginalFunc,
                 (value_type_conflict1 *)((long)&((this->pConditionalY).ptr)->funcInt + lVar3));
    }
    f.n = (long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
    f.ptr = marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
    PiecewiseConstant1D::PiecewiseConstant1D
              ((PiecewiseConstant1D *)&va,f,domain_local.pMin.super_Tuple2<pbrt::Point2,_float>.y,
               domain_local.pMax.super_Tuple2<pbrt::Point2,_float>.y,alloc_local);
    PiecewiseConstant1D::operator=(&this->pMarginal,(PiecewiseConstant1D *)&va);
    PiecewiseConstant1D::~PiecewiseConstant1D((PiecewiseConstant1D *)&va);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&marginalFunc.super__Vector_base<float,_std::allocator<float>_>);
    return;
  }
  LogFatal<char_const(&)[12],char_const(&)[24],char_const(&)[12],unsigned_long&,char_const(&)[24],unsigned_long&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.h"
             ,0x328,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [12])0x99d674,
             (char (*) [24])"(size_t)nx * (size_t)ny",(char (*) [12])0x99d674,&va,
             (char (*) [24])"(size_t)nx * (size_t)ny",(unsigned_long *)&marginalFunc);
}

Assistant:

PiecewiseConstant2D(pstd::span<const Float> func, int nx, int ny, Bounds2f domain,
                        Allocator alloc = {})
        : domain(domain), pConditionalY(alloc), pMarginal(alloc) {
        CHECK_EQ(func.size(), (size_t)nx * (size_t)ny);
        pConditionalY.reserve(ny);
        for (int y = 0; y < ny; ++y)
            // Compute conditional sampling distribution for $\tilde{y}$
            // TODO: emplace_back is key so the alloc sticks. WHY?
            pConditionalY.emplace_back(func.subspan(y * nx, nx), domain.pMin[0],
                                       domain.pMax[0], alloc);

        // Compute marginal sampling distribution $p[\tilde{y}]$
        std::vector<Float> marginalFunc;
        marginalFunc.reserve(ny);
        for (int y = 0; y < ny; ++y)
            marginalFunc.push_back(pConditionalY[y].funcInt);
        pMarginal =
            PiecewiseConstant1D(marginalFunc, domain.pMin[1], domain.pMax[1], alloc);
    }